

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual_memory.cpp
# Opt level: O2

void setPagesRX(void *ptr,size_t bytes)

{
  pageProtect(ptr,bytes,5);
  return;
}

Assistant:

void setPagesRX(void* ptr, std::size_t bytes) {
#if defined(USE_PTHREAD_JIT_WP) && defined(MAC_OS_VERSION_11_0) \
	&& MAC_OS_X_VERSION_MAX_ALLOWED >= MAC_OS_VERSION_11_0
	if (__builtin_available(macOS 11.0, *)) {
		pthread_jit_write_protect_np(true);
	} else {
		pageProtect(ptr, bytes, PAGE_EXECUTE_READ);
	}
#else
	pageProtect(ptr, bytes, PAGE_EXECUTE_READ);
#endif
}